

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3CompareElemByTerm(void *lhs,void *rhs)

{
  int iVar1;
  int iVar2;
  int local_3c;
  int local_38;
  int c;
  int n;
  int n2;
  int n1;
  char *z2;
  char *z1;
  void *rhs_local;
  void *lhs_local;
  
  iVar1 = *(int *)(*lhs + 0x20);
  iVar2 = *(int *)(*rhs + 0x20);
  local_3c = iVar2;
  if (iVar1 < iVar2) {
    local_3c = iVar1;
  }
  local_38 = memcmp(*(void **)(*lhs + 0x18),*(void **)(*rhs + 0x18),(long)local_3c);
  if (local_38 == 0) {
    local_38 = iVar1 - iVar2;
  }
  return local_38;
}

Assistant:

static int SQLITE_CDECL fts3CompareElemByTerm(
  const void *lhs,
  const void *rhs
){
  char *z1 = fts3HashKey(*(Fts3HashElem **)lhs);
  char *z2 = fts3HashKey(*(Fts3HashElem **)rhs);
  int n1 = fts3HashKeysize(*(Fts3HashElem **)lhs);
  int n2 = fts3HashKeysize(*(Fts3HashElem **)rhs);

  int n = (n1<n2 ? n1 : n2);
  int c = memcmp(z1, z2, n);
  if( c==0 ){
    c = n1 - n2;
  }
  return c;
}